

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMParserList.cpp
# Opt level: O1

PCMParserList * __thiscall ASDCP::PCMParserList::Reset(PCMParserList *this)

{
  int iVar1;
  long in_RSI;
  long lVar2;
  WAVParser aWStack_88 [6];
  
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  lVar2 = *(long *)(in_RSI + 8);
  if (lVar2 != *(long *)(in_RSI + 0x10)) {
    iVar1 = *(int *)&this->_vptr_PCMParserList;
    while (-1 < iVar1) {
      lVar2 = lVar2 + 8;
      PCM::WAVParser::Reset(aWStack_88);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)aWStack_88);
      Kumu::Result_t::~Result_t((Result_t *)aWStack_88);
      if (lVar2 == *(long *)(in_RSI + 0x10)) {
        return this;
      }
      iVar1 = *(int *)&this->_vptr_PCMParserList;
    }
  }
  return this;
}

Assistant:

Result_t
ASDCP::PCMParserList::Reset()
{
  Result_t result = RESULT_OK;
  PCMParserList::iterator self_i;

  for ( self_i = begin(); self_i != end() && ASDCP_SUCCESS(result) ; self_i++ )
    result = (*self_i)->Parser.Reset();

  return result;
}